

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream_p.h
# Opt level: O0

bool __thiscall
QXmlStreamReaderPrivate::referenceEntity
          (QXmlStreamReaderPrivate *this,QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *hash,
          Entity *entity)

{
  long lVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  QEntityReference *pQVar4;
  QString *in_RDX;
  QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff4c;
  ushort in_stack_ffffffffffffff4e;
  QXmlStreamReaderPrivate *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  QStringView *in_stack_ffffffffffffff60;
  bool local_51;
  qsizetype local_48;
  storage_type_conflict *local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)&in_RDX[2].d.d >> 4 & 1) == 0) {
    qVar2 = QString::size(in_RDX + 1);
    qVar3 = QString::size(in_RDX);
    *(int *)(in_RDI + 0x10c) = *(int *)(in_RDI + 0x10c) + ((int)qVar2 - (int)qVar3) + -2;
    if (*(int *)(in_RDI + 0x108) < *(int *)(in_RDI + 0x10c)) {
      QXmlStream::tr((char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                     (char *)in_stack_ffffffffffffff50,
                     CONCAT22(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff4c));
      raiseWellFormedError
                (in_stack_ffffffffffffff50,
                 (QString *)
                 CONCAT26(in_stack_ffffffffffffff4e,
                          CONCAT24(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)));
      QString::~QString((QString *)0x656674);
      local_51 = false;
    }
    else {
      *(byte *)&in_RDX[2].d.d = *(byte *)&in_RDX[2].d.d & 0xef | 0x10;
      QStringView::QStringView<QString,_true>
                (in_stack_ffffffffffffff60,
                 (QString *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      pQVar4 = QXmlStreamSimpleStack<QXmlStreamReaderPrivate::QEntityReference>::push
                         ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::QEntityReference> *)
                          in_stack_ffffffffffffff50);
      pQVar4->hash = in_RSI;
      (pQVar4->name).m_size = local_48;
      (pQVar4->name).m_data = local_40;
      injectToken(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4e);
      local_51 = true;
    }
  }
  else {
    QXmlStream::tr((char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                   (char *)in_stack_ffffffffffffff50,
                   CONCAT22(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff4c));
    raiseWellFormedError
              (in_stack_ffffffffffffff50,
               (QString *)
               CONCAT26(in_stack_ffffffffffffff4e,
                        CONCAT24(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)));
    QString::~QString((QString *)0x6565ba);
    local_51 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_51;
  }
  __stack_chk_fail();
}

Assistant:

inline bool referenceEntity(QHash<QStringView, Entity> *hash, Entity &entity)
    {
        Q_ASSERT(hash);
        if (entity.isCurrentlyReferenced) {
            raiseWellFormedError(QXmlStream::tr("Self-referencing entity detected."));
            return false;
        }
        // entityLength represents the amount of additional characters the
        // entity expands into (can be negative for e.g. &amp;). It's used to
        // avoid DoS attacks through recursive entity expansions
        entityLength += entity.value.size() - entity.name.size() - 2;
        if (entityLength > entityExpansionLimit) {
            raiseWellFormedError(QXmlStream::tr("Entity expands to more characters than the entity expansion limit."));
            return false;
        }
        entity.isCurrentlyReferenced = true;
        entityReferenceStack.push() = { hash, entity.name };
        injectToken(ENTITY_DONE);
        return true;
    }